

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

int fai_build(char *fn)

{
  size_t sVar1;
  char *__s;
  BGZF *fp_00;
  faidx_t *fai_00;
  FILE *__stream;
  faidx_t *fai;
  FILE *fp;
  BGZF *bgzf;
  char *str;
  char *fn_local;
  
  sVar1 = strlen(fn);
  __s = (char *)calloc(sVar1 + 5,1);
  sprintf(__s,"%s.fai",fn);
  fp_00 = bgzf_open(fn,"r");
  if (fp_00 == (BGZF *)0x0) {
    fprintf(_stderr,"[fai_build] fail to open the FASTA file %s\n",fn);
    free(__s);
    fn_local._4_4_ = -1;
  }
  else {
    if ((*(int *)fp_00 << 1) >> 0x1e != 0) {
      bgzf_index_build_init(fp_00);
    }
    fai_00 = fai_build_core(fp_00);
    if (fai_00 == (faidx_t *)0x0) {
      if (((*(int *)fp_00 << 1) >> 0x1e != 0) && (*(int *)fp_00 < 0)) {
        fprintf(_stderr,"Cannot index files compressed with gzip, please use bgzip\n");
      }
      free(__s);
      fn_local._4_4_ = -1;
    }
    else {
      if ((*(int *)fp_00 << 1) >> 0x1e != 0) {
        bgzf_index_dump(fp_00,fn,".gzi");
      }
      bgzf_close(fp_00);
      __stream = fopen(__s,"wb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"[fai_build] fail to write FASTA index %s\n",__s);
        fai_destroy(fai_00);
        free(__s);
        fn_local._4_4_ = -1;
      }
      else {
        fai_save(fai_00,(FILE *)__stream);
        fclose(__stream);
        free(__s);
        fai_destroy(fai_00);
        fn_local._4_4_ = 0;
      }
    }
  }
  return fn_local._4_4_;
}

Assistant:

int fai_build(const char *fn)
{
    char *str;
    BGZF *bgzf;
    FILE *fp;
    faidx_t *fai;
    str = (char*)calloc(strlen(fn) + 5, 1);
    sprintf(str, "%s.fai", fn);
    bgzf = bgzf_open(fn, "r");
    if ( !bgzf ) {
        fprintf(stderr, "[fai_build] fail to open the FASTA file %s\n",fn);
        free(str);
        return -1;
    }
    if ( bgzf->is_compressed ) bgzf_index_build_init(bgzf);
    fai = fai_build_core(bgzf);
    if ( !fai )
    {
        if ( bgzf->is_compressed && bgzf->is_gzip ) fprintf(stderr,"Cannot index files compressed with gzip, please use bgzip\n");
        free(str);
        return -1;
    }
    if ( bgzf->is_compressed ) bgzf_index_dump(bgzf, fn, ".gzi");
    bgzf_close(bgzf);
    fp = fopen(str, "wb");
    if ( !fp ) {
        fprintf(stderr, "[fai_build] fail to write FASTA index %s\n",str);
        fai_destroy(fai); free(str);
        return -1;
    }
    fai_save(fai, fp);
    fclose(fp);
    free(str);
    fai_destroy(fai);
    return 0;
}